

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cast.h
# Opt level: O0

ptr<Value> __thiscall Cast::evaluate(Cast *this,Environment *env)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  ThrowPacket *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar4;
  allocator<char> local_109;
  string local_108;
  ptr<Value> local_e8;
  byte local_d1;
  shared_ptr<Boolean> local_d0;
  undefined8 local_c0;
  shared_ptr<Integer> local_b8;
  shared_ptr<Double> local_a0;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined4 local_50;
  shared_ptr<Object> local_40;
  undefined1 local_30 [8];
  ptr<Value> value;
  Environment *env_local;
  Cast *this_local;
  
  value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX;
  peVar2 = std::__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &(env->symbols)._M_h._M_bucket_count);
  (**peVar2->_vptr_Expression)
            (local_30,peVar2,
             value.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  if ((int)(env->symbols)._M_h._M_element_count == 5) {
    peVar3 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    (*(peVar3->super_Member)._vptr_Member[6])(&local_40);
    std::shared_ptr<Value>::shared_ptr<Object,void>((shared_ptr<Value> *)this,&local_40);
    std::shared_ptr<Object>::~shared_ptr(&local_40);
  }
  else if ((int)(env->symbols)._M_h._M_element_count == 6) {
    peVar3 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    (*(peVar3->super_Member)._vptr_Member[7])(&local_70.field_2);
    std::shared_ptr<Value>::shared_ptr<Array,void>
              ((shared_ptr<Value> *)this,(shared_ptr<Array> *)&local_70.field_2);
    std::shared_ptr<Array>::~shared_ptr((shared_ptr<Array> *)&local_70.field_2);
  }
  else if ((int)(env->symbols)._M_h._M_element_count == 1) {
    peVar3 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    (*(peVar3->super_Member)._vptr_Member[2])(local_90);
    make<String,std::__cxx11::string>(&local_70);
    std::shared_ptr<Value>::shared_ptr<String,void>
              ((shared_ptr<Value> *)this,(shared_ptr<String> *)&local_70);
    std::shared_ptr<String>::~shared_ptr((shared_ptr<String> *)&local_70);
    std::__cxx11::string::~string(local_90);
  }
  else if ((int)(env->symbols)._M_h._M_element_count == 2) {
    peVar3 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    (*(peVar3->super_Member)._vptr_Member[4])();
    make<Double,double>((double *)&local_a0);
    std::shared_ptr<Value>::shared_ptr<Double,void>((shared_ptr<Value> *)this,&local_a0);
    std::shared_ptr<Double>::~shared_ptr(&local_a0);
  }
  else if ((int)(env->symbols)._M_h._M_element_count == 3) {
    peVar3 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    iVar1 = (*(peVar3->super_Member)._vptr_Member[3])();
    local_c0 = CONCAT44(extraout_var,iVar1);
    make<Integer,long_long>((longlong *)&local_b8);
    std::shared_ptr<Value>::shared_ptr<Integer,void>((shared_ptr<Value> *)this,&local_b8);
    std::shared_ptr<Integer>::~shared_ptr(&local_b8);
  }
  else {
    if ((int)(env->symbols)._M_h._M_element_count != 4) {
      this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"Could not cast value",&local_109);
      ExceptionObjects::bad_cast((ExceptionObjects *)&local_e8,&local_108);
      ThrowPacket::ThrowPacket(this_00,&local_e8);
      __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
    }
    peVar3 = std::__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    iVar1 = (*(peVar3->super_Member)._vptr_Member[5])();
    local_d1 = (byte)iVar1 & 1;
    make<Boolean,bool>((bool *)&local_d0);
    std::shared_ptr<Value>::shared_ptr<Boolean,void>((shared_ptr<Value> *)this,&local_d0);
    std::shared_ptr<Boolean>::~shared_ptr(&local_d0);
  }
  local_50 = 1;
  std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)local_30);
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> evaluate(Environment *env) override {
        ptr<Value> value = expression -> evaluate(env);

        if(type == Type::Object)
            return value -> asObject();
        else if(type == Type::Array)
            return value -> asArray();
        else if(type == Type::String)
            return make<String>(value -> asString());
        else if(type == Type::Double)
            return make<Double>(value -> asDouble());
        else if(type == Type::Integer)
            return make<Integer>(value -> asInteger());
        else if(type == Type::Boolean)
            return make<Boolean>(value -> asBoolean());

        throw ThrowPacket(ExceptionObjects::bad_cast("Could not cast value"));
    }